

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O2

void __thiscall
duckdb::CheckpointReader::LoadCheckpoint
          (CheckpointReader *this,CatalogTransaction transaction,MetadataReader *reader)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  bool bVar3;
  BinaryDeserializer deserializer;
  
  BinaryDeserializer::BinaryDeserializer(&deserializer,&reader->super_ReadStream);
  ::std::
  deque<std::reference_wrapper<duckdb::Catalog>,std::allocator<std::reference_wrapper<duckdb::Catalog>>>
  ::emplace_back<duckdb::Catalog&>
            ((deque<std::reference_wrapper<duckdb::Catalog>,std::allocator<std::reference_wrapper<duckdb::Catalog>>>
              *)&deserializer.super_Deserializer.data.catalogs,this->catalog);
  BinaryDeserializer::OnObjectBegin(&deserializer);
  (*deserializer.super_Deserializer._vptr_Deserializer[2])(&deserializer,100,"catalog_entries");
  iVar1 = (*deserializer.super_Deserializer._vptr_Deserializer[8])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  while( true ) {
    bVar3 = lVar2 == 0;
    lVar2 = lVar2 + -1;
    if (bVar3) break;
    (*deserializer.super_Deserializer._vptr_Deserializer[6])(&deserializer);
    (*this->_vptr_CheckpointReader[3])(this,&deserializer);
    (*deserializer.super_Deserializer._vptr_Deserializer[7])(&deserializer);
  }
  (*deserializer.super_Deserializer._vptr_Deserializer[9])(&deserializer);
  (*deserializer.super_Deserializer._vptr_Deserializer[3])();
  BinaryDeserializer::OnObjectEnd(&deserializer);
  SerializationData::Unset<duckdb::Catalog>(&deserializer.super_Deserializer.data);
  Deserializer::~Deserializer(&deserializer.super_Deserializer);
  return;
}

Assistant:

void CheckpointReader::LoadCheckpoint(CatalogTransaction transaction, MetadataReader &reader) {
	BinaryDeserializer deserializer(reader);
	deserializer.Set<Catalog &>(catalog);
	deserializer.Begin();
	deserializer.ReadList(100, "catalog_entries", [&](Deserializer::List &list, idx_t i) {
		return list.ReadObject([&](Deserializer &obj) { ReadEntry(transaction, obj); });
	});
	deserializer.End();
	deserializer.Unset<Catalog>();
}